

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

TestCase * TestIteratorTestdistance::factory(void)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x10);
  this->_vptr_TestCase = (_func_int **)0x0;
  this->result_ = (TestResult *)0x0;
  JsonTest::TestCase::TestCase(this);
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_0015f878;
  return this;
}

Assistant:

JSONTEST_FIXTURE(IteratorTest, distance) {
  Json::Value json;
  json["k1"] = "a";
  json["k2"] = "b";
  int dist = 0;
  std::string str;
  for (Json::ValueIterator it = json.begin(); it != json.end(); ++it) {
    dist = it - json.begin();
    str = it->asString().c_str();
  }
  JSONTEST_ASSERT_EQUAL(1, dist);
  JSONTEST_ASSERT_STRING_EQUAL("b", str);
}